

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly_mul_x_minus_1(poly *p)

{
  uint16_t uVar1;
  long lVar2;
  
  uVar1 = (p->field_0).v[700];
  for (lVar2 = 0x578; lVar2 != 0; lVar2 = lVar2 + -2) {
    *(short *)((long)&p->field_0 + lVar2) =
         *(short *)((long)p + lVar2 + -2) - *(short *)((long)&p->field_0 + lVar2);
  }
  (p->field_0).v[0] = uVar1 - (p->field_0).v[0];
  return;
}

Assistant:

static void poly_mul_x_minus_1(struct poly *p) {
  // Multiplying by (𝑥 - 1) means negating each coefficient and adding in
  // the value of the previous one.
  const uint16_t orig_final_coefficient = p->v[N - 1];

  for (size_t i = N - 1; i > 0; i--) {
    p->v[i] = p->v[i - 1] - p->v[i];
  }
  p->v[0] = orig_final_coefficient - p->v[0];
}